

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
* __thiscall chaiscript::Type_Conversions::thread_cache(Type_Conversions *this)

{
  _Map_base<const_void_*,_std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *this_01;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  *local_18;
  
  this_00 = (_Map_base<const_void_*,_std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)detail::threading::
               Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
               ::t();
  local_18 = &this->m_thread_cache;
  this_01 = &std::__detail::
             _Map_base<const_void_*,_std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_00,&local_18)->_M_t;
  if ((this_01->_M_impl).super__Rb_tree_header._M_node_count !=
      (this->m_num_types).super___atomic_base<unsigned_long>._M_i) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    std::
    _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::operator=(this_01,&(this->m_convertableTypes)._M_t);
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return (set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          *)this_01;
}

Assistant:

const std::set<const std::type_info *, Less_Than> &thread_cache() const {
      auto &cache = *m_thread_cache;
      if (cache.size() != m_num_types) {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
        cache = m_convertableTypes;
      }

      return cache;
    }